

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O0

undefined8 duckdb::MillisecondsFun::GetFunctions(void)

{
  undefined8 in_RDI;
  LogicalType *in_stack_000000c8;
  LogicalType local_20 [32];
  
  duckdb::LogicalType::LogicalType(local_20,BIGINT);
  GetTimePartFunction<duckdb::DatePart::MillisecondsOperator,long>(in_stack_000000c8);
  duckdb::LogicalType::~LogicalType(local_20);
  return in_RDI;
}

Assistant:

ScalarFunctionSet MillisecondsFun::GetFunctions() {
	return GetTimePartFunction<DatePart::MillisecondsOperator>();
}